

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  uint uVar1;
  uint uVar2;
  ImDrawCmd *__src;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  ImVec4 *pIVar8;
  ImDrawCmd *pIVar9;
  long lVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  
  lVar10 = (long)(this->_TextureIdStack).Size;
  if (lVar10 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar10 + -1];
  }
  uVar1 = (this->CmdBuffer).Size;
  uVar13 = (ulong)uVar1;
  if (uVar13 != 0) {
    if ((int)uVar1 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui.h"
                    ,0x538,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    pIVar9 = (this->CmdBuffer).Data;
    if ((pIVar9 + (uVar13 - 1) != (ImDrawCmd *)0x0) &&
       (((uVar2 = pIVar9[uVar13 - 1].ElemCount, uVar2 == 0 ||
         (pIVar9[uVar13 - 1].TextureId == pvVar11)) &&
        (pIVar9[uVar13 - 1].UserCallback == (ImDrawCallback)0x0)))) {
      if (((uVar1 != 1) && (uVar2 == 0)) && (pIVar9[uVar13 - 2].TextureId == pvVar11)) {
        lVar10 = (long)(this->_ClipRectStack).Size;
        pIVar8 = (this->_ClipRectStack).Data + lVar10 + -1;
        if (lVar10 == 0) {
          pIVar8 = &this->_Data->ClipRectFullscreen;
        }
        auVar15[0] = -(*(char *)&pIVar8->x == *(char *)&pIVar9[uVar13 - 2].ClipRect.x);
        auVar15[1] = -(*(char *)((long)&pIVar8->x + 1) ==
                      *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.x + 1));
        auVar15[2] = -(*(char *)((long)&pIVar8->x + 2) ==
                      *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.x + 2));
        auVar15[3] = -(*(char *)((long)&pIVar8->x + 3) ==
                      *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.x + 3));
        auVar15[4] = -(*(char *)&pIVar8->y == *(char *)&pIVar9[uVar13 - 2].ClipRect.y);
        auVar15[5] = -(*(char *)((long)&pIVar8->y + 1) ==
                      *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.y + 1));
        auVar15[6] = -(*(char *)((long)&pIVar8->y + 2) ==
                      *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.y + 2));
        auVar15[7] = -(*(char *)((long)&pIVar8->y + 3) ==
                      *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.y + 3));
        auVar15[8] = -(*(char *)&pIVar8->z == *(char *)&pIVar9[uVar13 - 2].ClipRect.z);
        auVar15[9] = -(*(char *)((long)&pIVar8->z + 1) ==
                      *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.z + 1));
        auVar15[10] = -(*(char *)((long)&pIVar8->z + 2) ==
                       *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.z + 2));
        auVar15[0xb] = -(*(char *)((long)&pIVar8->z + 3) ==
                        *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.z + 3));
        auVar15[0xc] = -(*(char *)&pIVar8->w == *(char *)&pIVar9[uVar13 - 2].ClipRect.w);
        auVar15[0xd] = -(*(char *)((long)&pIVar8->w + 1) ==
                        *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.w + 1));
        auVar15[0xe] = -(*(char *)((long)&pIVar8->w + 2) ==
                        *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.w + 2));
        auVar15[0xf] = -(*(char *)((long)&pIVar8->w + 3) ==
                        *(char *)((long)&pIVar9[uVar13 - 2].ClipRect.w + 3));
        if (((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar15[0xf] >> 7) << 0xf) == 0xffff) &&
           (pIVar9[uVar13 - 2].UserCallback == (ImDrawCallback)0x0)) {
          (this->CmdBuffer).Size = uVar1 - 1;
          return;
        }
      }
      pIVar9[uVar13 - 1].TextureId = pvVar11;
      return;
    }
  }
  lVar10 = (long)(this->_ClipRectStack).Size;
  pIVar8 = (this->_ClipRectStack).Data + lVar10 + -1;
  if (lVar10 == 0) {
    pIVar8 = &this->_Data->ClipRectFullscreen;
  }
  fVar3 = pIVar8->x;
  fVar4 = pIVar8->y;
  fVar5 = pIVar8->z;
  fVar6 = pIVar8->w;
  lVar10 = (long)(this->_TextureIdStack).Size;
  if (lVar10 == 0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pvVar11 = (this->_TextureIdStack).Data[lVar10 + -1];
  }
  if ((fVar3 <= fVar5) && (fVar4 <= fVar6)) {
    uVar1 = (this->IdxBuffer).Size;
    uVar2 = this->_VtxCurrentOffset;
    iVar7 = (this->CmdBuffer).Size;
    if (iVar7 == (this->CmdBuffer).Capacity) {
      if (iVar7 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar7 / 2 + iVar7;
      }
      iVar14 = iVar7 + 1;
      if (iVar7 + 1 < iVar12) {
        iVar14 = iVar12;
      }
      pIVar9 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar14 * 0x38);
      __src = (this->CmdBuffer).Data;
      if (__src != (ImDrawCmd *)0x0) {
        memcpy(pIVar9,__src,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar9;
      (this->CmdBuffer).Capacity = iVar14;
      iVar7 = (this->CmdBuffer).Size;
    }
    else {
      pIVar9 = (this->CmdBuffer).Data;
    }
    pIVar9[iVar7].ElemCount = 0;
    pIVar8 = &pIVar9[iVar7].ClipRect;
    pIVar8->x = fVar3;
    pIVar8->y = fVar4;
    pIVar8->z = fVar5;
    pIVar8->w = fVar6;
    pIVar9[iVar7].TextureId = pvVar11;
    pIVar9[iVar7].VtxOffset = uVar2;
    pIVar9[iVar7].IdxOffset = uVar1;
    pIVar9[iVar7].UserCallback = (ImDrawCallback)0x0;
    (&pIVar9[iVar7].UserCallback)[1] = (ImDrawCallback)0x0;
    (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GPMueller[P]imgui-cmake/thirdparty/imgui/imgui_draw.cpp"
                ,0x1af,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}